

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTestListener.cpp
# Opt level: O0

unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_> __thiscall
rc::detail::makeDefaultTestListener(detail *this,Configuration *config,ostream *os)

{
  value_type local_58 [3];
  value_type local_40;
  undefined1 local_38 [8];
  Listeners listeners;
  ostream *os_local;
  Configuration *config_local;
  
  listeners.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)os;
  std::
  vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ::vector((vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
            *)local_38);
  (anonymous_namespace)::
  makeListener<rc::detail::LogTestListener,std::ostream&,bool_const&,bool_const&>
            ((_anonymous_namespace_ *)&local_40,
             (basic_ostream<char,_std::char_traits<char>_> *)
             listeners.
             super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,&config->verboseProgress,
             &config->verboseShrinking);
  std::
  vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ::push_back((vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
               *)local_38,&local_40);
  std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>::
  ~unique_ptr(&local_40);
  (anonymous_namespace)::makeListener<rc::detail::ReproduceListener,std::ostream&>
            ((_anonymous_namespace_ *)local_58,
             (basic_ostream<char,_std::char_traits<char>_> *)
             listeners.
             super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ::push_back((vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
               *)local_38,local_58);
  std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>::
  ~unique_ptr(local_58);
  (anonymous_namespace)::
  makeListener<rc::detail::MulticastTestListener,std::vector<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>,std::allocator<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>>>>
            ((_anonymous_namespace_ *)this,
             (vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
              *)local_38);
  std::
  vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ::~vector((vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
             *)local_38);
  return (__uniq_ptr_data<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>,_true,_true>
          )(__uniq_ptr_data<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TestListener>
makeDefaultTestListener(const Configuration &config, std::ostream &os) {
  MulticastTestListener::Listeners listeners;
  listeners.push_back(makeListener<LogTestListener>(
      os, config.verboseProgress, config.verboseShrinking));
  listeners.push_back(makeListener<ReproduceListener>(os));
  return makeListener<MulticastTestListener>(std::move(listeners));
}